

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddImportedGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  pointer *pppcVar1;
  iterator __position;
  cmGeneratorTarget *local_10;
  
  __position._M_current =
       (this->ImportedGeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = gt;
  if (__position._M_current ==
      (this->ImportedGeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
    _M_realloc_insert<cmGeneratorTarget*const&>
              ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
               &this->ImportedGeneratorTargets,__position,&local_10);
  }
  else {
    *__position._M_current = gt;
    pppcVar1 = &(this->ImportedGeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_10);
  return;
}

Assistant:

void cmLocalGenerator::AddImportedGeneratorTarget(cmGeneratorTarget* gt)
{
  this->ImportedGeneratorTargets.push_back(gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}